

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax(UnaryPropertyExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  Compilation *this;
  AssertionExpr *this_00;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar2;
  bitmask<slang::ast::ASTFlags> addedFlags;
  UnaryAssertionOperator op;
  UnaryAssertionOperator local_6c;
  ASTContext local_68;
  
  local_6c = getUnaryOp((syntax->op).kind);
  addedFlags.m_bits = 0x1000000;
  if (local_6c != NextTime) {
    addedFlags.m_bits = (underlying_type)((~local_6c & 1) << 0x17);
  }
  this = ASTContext::getCompilation(context);
  this_00 = (AssertionExpr *)not_null<slang::syntax::PropertyExprSyntax_*>::get(&syntax->expr);
  ASTContext::resetFlags(&local_68,context,addedFlags);
  iVar1 = AssertionExpr::bind(this_00,(int)&local_68,(sockaddr *)0x0,0);
  pUVar2 = BumpAllocator::
           emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::nullopt_t_const&>
                     (&this->super_BumpAllocator,&local_6c,
                      (AssertionExpr *)CONCAT44(extraout_var,iVar1),(nullopt_t *)&std::nullopt);
  return &pUVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& UnaryAssertionExpr::fromSyntax(const UnaryPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto op = getUnaryOp(syntax.op.kind);

    bitmask<ASTFlags> extraFlags;
    if (op == UnaryAssertionOperator::NextTime)
        extraFlags = ASTFlags::PropertyTimeAdvance;
    else if (isNegationOp(op))
        extraFlags = ASTFlags::PropertyNegation;

    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context.resetFlags(extraFlags));
    return *comp.emplace<UnaryAssertionExpr>(op, expr, std::nullopt);
}